

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  int32_t iVar2;
  int *in_RDI;
  int32_t k;
  size_t count;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  undefined8 local_10;
  
  uVar1 = ra_portable_header_size
                    ((roaring_array_t *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  local_10 = (ulong)uVar1;
  for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
    iVar2 = container_size_in_bytes((container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),'\0');
    local_10 = (long)iVar2 + local_10;
  }
  return local_10;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}